

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall WrongVersionException::~WrongVersionException(WrongVersionException *this)

{
  WrongVersionException *this_local;
  
  ~WrongVersionException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

WrongVersionException(const std::string& message) : LandstalkerException(message)
    {}